

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O0

void __thiscall
assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[24]>
          (asmcode *this,operation *val,char (*val_1) [24])

{
  operation oVar1;
  reference this_00;
  reference this_01;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  instruction ins;
  char (*val_local_1) [24];
  operation *val_local;
  asmcode *this_local;
  
  oVar1 = *val;
  ins.text.field_2._8_8_ = val_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,*val_1,&local_81);
  assembler::asmcode::instruction::instruction((instruction *)local_60,oVar1,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  this_00 = std::
            vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
            ::back((vector<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>,_std::allocator<std::_List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>_>_>
                    *)(this + 0x18));
  this_01 = std::
            _List_iterator<std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>_>
            ::operator*(this_00);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back(this_01,(value_type *)local_60);
  instruction::~instruction((instruction *)local_60);
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }